

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint pktlen;
  uint16_t uVar1;
  int iVar2;
  void *p;
  __sighandler_t p_Var3;
  int extraout_EDX;
  nettlp *__buf;
  undefined8 extraout_RDX;
  char *pcVar4;
  long lVar5;
  psmem_thread *__newthread;
  uintptr_t uVar6;
  uint16_t devn;
  uint16_t busn;
  uint local_3bc;
  uint local_3b8;
  in_addr remote_host;
  uintptr_t addr;
  nettlp nt;
  psmem psmem;
  nettlp_cb cb;
  psmem_thread pth [16];
  
  nt.sockfd = 0;
  nt.port = 0;
  nt._22_2_ = 0;
  addr = 0;
  busn = 0;
  devn = 0;
  nt.remote_addr.s_addr = 0;
  nt.local_addr.s_addr = 0;
  nt.requester = 0;
  nt.tag = '\0';
  nt._11_1_ = 0;
  nt.dir = DMA_ISSUED_BY_LIBTLP;
  local_3bc = 0;
  local_3b8 = 0;
LAB_00102a20:
  do {
    iVar2 = getopt(argc,argv,"r:l:b:R:a:m:HSn:s:");
    uVar6 = addr;
    switch(iVar2) {
    case 0x6c:
      __buf = (nettlp *)&nt.local_addr;
      break;
    case 0x6d:
      mrd_sleep = atoi(_optarg);
      goto LAB_00102a20;
    case 0x6e:
      local_3bc = atoi(_optarg);
      goto LAB_00102a20;
    case 0x6f:
    case 0x70:
    case 0x71:
      goto switchD_00102a9a_caseD_6f;
    case 0x72:
      __buf = &nt;
      break;
    case 0x73:
      local_3b8 = atoi(_optarg);
      goto LAB_00102a20;
    default:
      if (iVar2 == 0x48) {
        nohex = 1;
      }
      else if (iVar2 == 0x52) {
        iVar2 = inet_pton(2,_optarg,&remote_host);
        if (iVar2 < 1) goto LAB_00102d2f;
        addr = nettlp_msg_get_bar4_start(remote_host);
        if (addr == 0) {
          pcVar4 = "nettlp_msg_get_bar4_start";
          goto LAB_00102dae;
        }
        uVar1 = nettlp_msg_get_dev_id(remote_host);
        nt.requester = uVar1;
      }
      else if (iVar2 == 0x53) {
        nostdout = '\x01';
      }
      else if (iVar2 == 0x61) {
        __isoc99_sscanf(_optarg,"0x%lx",&addr);
      }
      else {
        if (iVar2 != 0x62) {
          if (iVar2 != -1) {
switchD_00102a9a_caseD_6f:
            usage();
            return -1;
          }
          psmem.addr = addr;
          p = malloc(0x10000000);
          pktlen = local_3b8;
          psmem.size = 0x10000000;
          cb.other = (_func_int_nettlp_ptr_tlp_hdr_ptr_void_ptr *)0x0;
          cb.start = 0;
          cb.end = 0;
          cb.cpl = (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *)0x0;
          cb.cpld = (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr_size_t_void_ptr *)0x0;
          cb.mrd = psmem_mrd;
          cb.mwr = psmem_mwr;
          iVar2 = (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),
                                0x3b < (int)local_3b8 && 0 < (int)local_3bc);
          psmem.mem = p;
          if (0x3b < (int)local_3b8 && 0 < (int)local_3bc) {
            if (0x800 < local_3b8) {
              fprintf(_stderr,"%s:ERR: too large packet size. must be <= 2048\n","main");
              return -1;
            }
            if (nostdout == '\0') {
              fprintf(_stdout,"%s: initalize the region with %d %d-byte packets\n","main",
                      (ulong)local_3bc,(ulong)local_3b8);
              iVar2 = extraout_EDX;
            }
            initialize_with_packets(p,pktlen,iVar2);
            uVar6 = addr;
          }
          lVar5 = 0;
          printf("start psmem callbacks. BAR4 is %#lx, Dev is 0x%x\n",uVar6,nt._8_8_ & 0xffff);
          __newthread = pth;
          goto LAB_00102c68;
        }
        __isoc99_sscanf(_optarg,"%hx:%hx",&busn,&devn);
        nt.requester = busn << 8 | devn;
      }
      goto LAB_00102a20;
    }
    iVar2 = inet_pton(2,_optarg,__buf);
  } while (0 < iVar2);
LAB_00102d2f:
  pcVar4 = "inet_pton";
LAB_00102dae:
  perror(pcVar4);
  return -1;
LAB_00102c68:
  if (lVar5 == 0x10) goto LAB_00102cf3;
  __newthread->psmem = &psmem;
  __newthread->cb = &cb;
  (__newthread->nt).remote_addr = (in_addr)nt.remote_addr.s_addr;
  (__newthread->nt).local_addr = (in_addr)nt.local_addr.s_addr;
  (__newthread->nt).requester = nt.requester;
  (__newthread->nt).tag = nt.tag;
  (__newthread->nt).field_0xb = nt._11_1_;
  (__newthread->nt).dir = nt.dir;
  (__newthread->nt).sockfd = nt.sockfd;
  (__newthread->nt).port = nt.port;
  *(undefined2 *)&(__newthread->nt).field_0x16 = nt._22_2_;
  (__newthread->nt).tag = (uint8_t)lVar5;
  (__newthread->nt).dir = DMA_ISSUED_BY_ADAPTER;
  iVar2 = nettlp_init(&__newthread->nt);
  if (iVar2 < 0) {
    fprintf(_stderr,"%s:ERR: nettlp_init for tag %u failed","main",(ulong)(__newthread->nt).tag);
    pcVar4 = "nettlp_init";
LAB_00102d9d:
    perror(pcVar4);
    return iVar2;
  }
  iVar2 = pthread_create(&__newthread->tid,(pthread_attr_t *)0x0,nettlp_cb_thread,__newthread);
  if (iVar2 < 0) {
    fprintf(_stderr,"%s:ERR: failed to create thread for cpu %u","main",(ulong)(__newthread->nt).tag
           );
    pcVar4 = "pthread_create";
    goto LAB_00102d9d;
  }
  usleep(0x14);
  lVar5 = lVar5 + 1;
  __newthread = __newthread + 1;
  goto LAB_00102c68;
LAB_00102cf3:
  p_Var3 = signal(2,sig_handler);
  if (p_Var3 != (__sighandler_t)0xffffffffffffffff) {
    for (lVar5 = 0; lVar5 != 0x300; lVar5 = lVar5 + 0x30) {
      pthread_join(*(pthread_t *)((long)&pth[0].tid + lVar5),(void **)0x0);
    }
    return 0;
  }
  pcVar4 = "cannot set signal\n";
  goto LAB_00102dae;
}

Assistant:

int main(int argc, char **argv)
{

#define NTHREADS	16	/* adapter v0.15.1 uses tag & 0xF for ports */

	int ret, ch, n;
	struct in_addr remote_host;
	struct psmem psmem;
	struct nettlp nt;	/* the original nettlp */
	struct nettlp_cb cb;
	struct psmem_thread pth[NTHREADS];
	uintptr_t addr;
	uint16_t busn, devn;
	int pktnum, pktlen;

	memset(&nt, 0, sizeof(nt));
	addr = 0;
	busn = 0;
	devn = 0;

	pktnum = 0;
	pktlen = 0;

	while ((ch = getopt(argc, argv, "r:l:b:R:a:m:HSn:s:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 'R':
			ret = inet_pton(AF_INET, optarg, &remote_host);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}

			addr = nettlp_msg_get_bar4_start(remote_host);
			if (addr == 0) {
				perror("nettlp_msg_get_bar4_start");
				return -1;
			}

			nt.requester = nettlp_msg_get_dev_id(remote_host);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 'm':
			mrd_sleep = atoi(optarg);
			break;

		case 'H':
			nohex = 1;
			break;

		case 'S':
			nostdout = 1;
			break;

		case 'n':
			pktnum = atoi(optarg);
			break;

		case 's':
			pktlen = atoi(optarg);
			break;

		default :
			usage();
			return -1;
		}
	}

	/* initalize psmem area and callback */
	psmem.addr = addr;
	psmem.mem = malloc(1024 * 1024 * 256);	/* 256MB */
	psmem.size = 1024 * 1024 * 256;

	memset(&cb, 0, sizeof(cb));
	cb.mrd = psmem_mrd;
	cb.mwr = psmem_mwr;

	if (pktnum > 0 && pktlen >= 60) {
		if (pktlen > 2048) {
			pr_err("too large packet size. must be <= 2048\n");
			return -1;
		}

		pr_info("initalize the region with %d %d-byte packets\n",
			pktnum, pktlen);
		initialize_with_packets(psmem.mem, pktlen, pktnum);
	}

	printf("start psmem callbacks. BAR4 is %#lx, Dev is 0x%x\n",
	       addr, nt.requester);

	/* initalize and start threads on each port 0x3000 + 0x0 ~ 0xF */
	for (n = 0; n < NTHREADS; n++) {
		pth[n].psmem = &psmem;
		pth[n].cb = &cb;
		pth[n].nt = nt;
		pth[n].nt.tag = n;
		pth[n].nt.dir = DMA_ISSUED_BY_ADAPTER;

		ret = nettlp_init(&pth[n].nt);
		if (ret < 0) {
			pr_err("nettlp_init for tag %u failed", pth[n].nt.tag);
			perror("nettlp_init");
			return ret;
		}

		ret = pthread_create(&pth[n].tid, NULL, nettlp_cb_thread,
				     &pth[n]);
		if (ret < 0) {
			pr_err("failed to create thread for cpu %u",
			       pth[n].nt.tag);
			perror("pthread_create");
			return ret;
		}

		usleep(20);	/*XXX: to serialiez start output on threads */
	}

	/* set signal handler to stop callback threads */
	if (signal(SIGINT, sig_handler) == SIG_ERR) {
		perror("cannot set signal\n");
		return -1;
	}

	/* thread join */
	for (n = 0; n < NTHREADS; n++)
		pthread_join(pth[n].tid, NULL);

	return 0;
}